

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator)

{
  xmlChar *pxVar1;
  long lVar2;
  xmlParserCtxtPtr ctx;
  
  if (locator != (xmlTextReaderLocatorPtr)0x0) {
    if (*(xmlNode **)((long)locator + 0x50) != (xmlNode *)0x0) {
      pxVar1 = xmlNodeGetBase((xmlDoc *)0x0,*(xmlNode **)((long)locator + 0x50));
      return pxVar1;
    }
    lVar2 = *(long *)((long)locator + 0x38);
    if ((*(long *)(lVar2 + 8) == 0) && (1 < (long)*(int *)((long)locator + 0x40))) {
      lVar2 = *(long *)(*(long *)((long)locator + 0x48) + -0x10 +
                       (long)*(int *)((long)locator + 0x40) * 8);
    }
    if (lVar2 != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)(lVar2 + 8));
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator) {
    /* we know that locator is a xmlParserCtxtPtr */
    xmlParserCtxtPtr ctx = (xmlParserCtxtPtr)locator;
    xmlChar *ret = NULL;

    if (locator == NULL)
        return(NULL);
    if (ctx->node != NULL) {
	ret = xmlNodeGetBase(NULL,ctx->node);
    }
    else {
	/* inspired from error.c */
	xmlParserInputPtr input;
	input = ctx->input;
	if ((input->filename == NULL) && (ctx->inputNr > 1))
	    input = ctx->inputTab[ctx->inputNr - 2];
	if (input != NULL) {
	    ret = xmlStrdup(BAD_CAST input->filename);
	}
	else {
	    ret = NULL;
	}
    }

    return ret;
}